

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.cpp
# Opt level: O3

void __thiscall duckdb::ArenaAllocator::Destroy(ArenaAllocator *this)

{
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> this_00;
  
  this_00._M_head_impl =
       (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
       _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
       super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
  (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
  super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl = (ArenaChunk *)0x0;
  if (this_00._M_head_impl != (ArenaChunk *)0x0) {
    ArenaChunk::~ArenaChunk(this_00._M_head_impl);
    operator_delete(this_00._M_head_impl);
  }
  this->tail = (ArenaChunk *)0x0;
  this->allocated_size = 0;
  return;
}

Assistant:

void ArenaAllocator::Destroy() {
	head = nullptr;
	tail = nullptr;
	allocated_size = 0;
}